

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

int __thiscall cmCTestMemCheckHandler::PostProcessHandler(cmCTestMemCheckHandler *this)

{
  cmCTest *this_00;
  int iVar1;
  int iVar2;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  long local_188 [14];
  ios_base local_118 [264];
  
  iVar1 = cmCTestTestHandler::ExecuteCommands
                    (&this->super_cmCTestTestHandler,&this->CustomPostMemCheck);
  iVar2 = 1;
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Problem executing post-memcheck command(s).",0x2b);
    std::ios::widen((char)(ostringstream *)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18));
    std::ostream::put((char)local_188);
    std::ostream::flush();
    this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0xbd,(char *)local_1a8,false);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int cmCTestMemCheckHandler::PostProcessHandler()
{
  if ( !this->ExecuteCommands(this->CustomPostMemCheck) )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Problem executing post-memcheck command(s)." << std::endl);
    return 0;
    }
  return 1;
}